

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapped_transform.cc
# Opt level: O2

void __thiscall
webrtc::LappedTransform::LappedTransform
          (LappedTransform *this,size_t num_in_channels,size_t num_out_channels,size_t chunk_length,
          float *window,size_t block_length,size_t shift_amount,Callback *callback)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  string *psVar4;
  ostream *poVar5;
  uint local_1ac;
  FatalMessage local_1a8;
  
  (this->blocker_callback_).super_BlockerCallback._vptr_BlockerCallback =
       (_func_int **)&PTR__BlockerCallback_001d3c68;
  (this->blocker_callback_).parent_ = this;
  this->num_in_channels_ = num_in_channels;
  this->num_out_channels_ = num_out_channels;
  this->block_length_ = block_length;
  this->chunk_length_ = chunk_length;
  this->block_processor_ = callback;
  Blocker::Blocker(&this->blocker_,chunk_length,block_length,num_in_channels,num_out_channels,window
                   ,shift_amount,(BlockerCallback *)this);
  iVar2 = RealFourier::FftOrder(this->block_length_);
  RealFourier::Create((RealFourier *)&local_1a8,iVar2);
  (this->fft_)._M_t.
  super___uniq_ptr_impl<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::RealFourier_*,_std::default_delete<webrtc::RealFourier>_>.
  super__Head_base<0UL,_webrtc::RealFourier_*,_false>._M_head_impl = (RealFourier *)local_1a8._0_8_;
  iVar2 = (*(*(_func_int ***)local_1a8._0_8_)[4])();
  sVar3 = RealFourier::ComplexLength(iVar2);
  this->cplx_length_ = sVar3;
  AlignedArray<float>::AlignedArray(&this->real_buf_,num_in_channels,this->block_length_,0x20);
  AlignedArray<std::complex<float>_>::AlignedArray
            (&this->cplx_pre_,num_in_channels,this->cplx_length_,0x20);
  AlignedArray<std::complex<float>_>::AlignedArray
            (&this->cplx_post_,num_out_channels,this->cplx_length_,0x20);
  if ((this->num_in_channels_ == 0) || (this->num_out_channels_ == 0)) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,0x57);
    poVar5 = std::operator<<((ostream *)&local_1a8,
                             "Check failed: num_in_channels_ > 0 && num_out_channels_ > 0");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<(poVar5,"# ");
  }
  else {
    local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
    psVar4 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                       (&this->block_length_,(uint *)&local_1a8,"block_length_ > 0u");
    if (psVar4 == (string *)0x0) {
      local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
      psVar4 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                         (&this->chunk_length_,(uint *)&local_1a8,"chunk_length_ > 0u");
      if (psVar4 == (string *)0x0) {
        if (this->block_processor_ == (Callback *)0x0) {
          rtc::FatalMessage::FatalMessage
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
                     ,0x5a);
          poVar5 = std::operator<<((ostream *)&local_1a8,"Check failed: block_processor_");
          poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
          std::operator<<(poVar5,"# ");
        }
        else {
          local_1ac = 0;
          uVar1 = this->block_length_;
          local_1a8._0_8_ = uVar1 - 1 & uVar1;
          psVar4 = rtc::CheckEQImpl<unsigned_int,unsigned_long>
                             (&local_1ac,(unsigned_long *)&local_1a8,
                              "0u == block_length_ & (block_length_ - 1)");
          if (psVar4 == (string *)0x0) {
            return;
          }
          rtc::FatalMessage::FatalMessage
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
                     ,0x5d,psVar4);
        }
      }
      else {
        rtc::FatalMessage::FatalMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
                   ,0x59,psVar4);
      }
    }
    else {
      rtc::FatalMessage::FatalMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
                 ,0x58,psVar4);
    }
  }
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

LappedTransform::LappedTransform(size_t num_in_channels,
                                 size_t num_out_channels,
                                 size_t chunk_length,
                                 const float* window,
                                 size_t block_length,
                                 size_t shift_amount,
                                 Callback* callback)
    : blocker_callback_(this),
      num_in_channels_(num_in_channels),
      num_out_channels_(num_out_channels),
      block_length_(block_length),
      chunk_length_(chunk_length),
      block_processor_(callback),
      blocker_(chunk_length_,
               block_length_,
               num_in_channels_,
               num_out_channels_,
               window,
               shift_amount,
               &blocker_callback_),
      fft_(rtc::ScopedToUnique(
          RealFourier::Create(RealFourier::FftOrder(block_length_)))),
      cplx_length_(RealFourier::ComplexLength(fft_->order())),
      real_buf_(num_in_channels,
                block_length_,
                RealFourier::kFftBufferAlignment),
      cplx_pre_(num_in_channels,
                cplx_length_,
                RealFourier::kFftBufferAlignment),
      cplx_post_(num_out_channels,
                 cplx_length_,
                 RealFourier::kFftBufferAlignment) {
  RTC_CHECK(num_in_channels_ > 0 && num_out_channels_ > 0);
  RTC_CHECK_GT(block_length_, 0u);
  RTC_CHECK_GT(chunk_length_, 0u);
  RTC_CHECK(block_processor_);

  // block_length_ power of 2?
  RTC_CHECK_EQ(0u, block_length_ & (block_length_ - 1));
}